

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_netstd_doc(t_netstd_generator *this,ostream *out,t_function *tfunction)

{
  size_type *psVar1;
  t_struct *ptVar2;
  t_field *ptVar3;
  pointer pcVar4;
  ostream *poVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  pointer pptVar12;
  string str;
  stringstream ps;
  string local_2d0;
  string local_2b0;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  t_netstd_generator *local_270;
  ostream *local_268;
  t_function *local_260;
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  string local_238;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((tfunction->super_t_doc).has_doc_ != true) {
    return;
  }
  local_270 = this;
  local_268 = out;
  std::__cxx11::stringstream::stringstream(local_1b8);
  ptVar2 = tfunction->arglist_;
  pptVar12 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_260 = tfunction;
  if (pptVar12 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar3 = *pptVar12;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<param name=\"",0xd);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">",2);
      if ((ptVar3->super_t_doc).has_doc_ == true) {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        pcVar4 = (ptVar3->super_t_doc).doc_._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,pcVar4,pcVar4 + (ptVar3->super_t_doc).doc_._M_string_length)
        ;
        local_238._M_dataplus._M_p._0_1_ = 10;
        _Var6 = std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_2d0._M_dataplus._M_p,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_2d0._M_dataplus._M_p + local_2d0._M_string_length),
                           (_Iter_equals_val<const_char>)&local_238);
        local_2d0._M_string_length = (long)_Var6._M_current - (long)local_2d0._M_dataplus._M_p;
        *_Var6._M_current = '\0';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"</param>",8);
      pptVar12 = pptVar12 + 1;
    } while (pptVar12 !=
             (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"/// ","");
  std::operator+(&local_1d8,"<summary>",&::endl_abi_cxx11_);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1d8,
                              (ulong)(local_260->super_t_doc).doc_._M_dataplus._M_p);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_208 = *plVar9;
    lStack_200 = plVar7[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar9;
    local_218 = (long *)*plVar7;
  }
  local_210 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_280 = *puVar10;
    lStack_278 = plVar7[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *puVar10;
    local_290 = (ulong *)*plVar7;
  }
  local_288 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar11 = 0xf;
  if (local_290 != &local_280) {
    uVar11 = local_280;
  }
  if (uVar11 < (ulong)(local_250 + local_288)) {
    uVar11 = 0xf;
    if (local_258 != local_248) {
      uVar11 = local_248[0];
    }
    if ((ulong)(local_250 + local_288) <= uVar11) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_290);
      goto LAB_002ceed8;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_258);
LAB_002ceed8:
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2b0.field_2._M_allocated_capacity = *psVar1;
    local_2b0.field_2._8_4_ = *(undefined4 *)(puVar8 + 3);
    local_2b0.field_2._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar1;
    local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  docstring_comment(local_270,local_268,&local_2d0,&local_238,&local_2b0,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_doc(ostream& out, t_function* tfunction)
{
    if (tfunction->has_doc())
    {
        stringstream ps;
        const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
        vector<t_field*>::const_iterator p_iter;
        for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter)
        {
            t_field* p = *p_iter;
            ps << endl << "<param name=\"" << p->get_name() << "\">";
            if (p->has_doc())
            {
                string str = p->get_doc();
                str.erase(remove(str.begin(), str.end(), '\n'), str.end());
                ps << str;
            }
            ps << "</param>";
        }

        docstring_comment(out,
                                   "",
                                   "/// ",
                                   "<summary>" + endl + tfunction->get_doc() + "</summary>" + ps.str(),
                                   "");
    }
}